

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O2

parasail_profile_t *
parasail_profile_create_sse_128_8(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  __m128i *palVar4;
  parasail_profile_t *ppVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  int8_t iVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t size;
  __m128i_8_t t;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    pcVar8 = "matrix";
  }
  else {
    if (s1 != (char *)0x0 || matrix->type != 0) {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      uVar1 = matrix->size;
      lVar11 = (long)(int)uVar1;
      uVar17 = (long)(_s1Len + 0xf) / 0x10;
      iVar3 = (int)uVar17;
      size = iVar3 * lVar11;
      palVar4 = parasail_memalign___m128i(0x10,size);
      if (palVar4 != (__m128i *)0x0) {
        ppVar5 = parasail_profile_new(s1,_s1Len,matrix);
        uVar13 = 0;
        if (ppVar5 != (parasail_profile_t *)0x0) {
          uVar17 = uVar17 & 0xffffffff;
          if (iVar3 < 1) {
            uVar17 = uVar13;
          }
          uVar6 = 0;
          if (0 < (int)uVar1) {
            uVar6 = (ulong)uVar1;
          }
          lVar14 = 0;
          do {
            if (uVar13 == uVar6) {
              (ppVar5->profile8).score = palVar4;
              ppVar5->free = parasail_free___m128i;
              return ppVar5;
            }
            lVar14 = (long)(int)lVar14;
            lVar7 = 0;
            for (uVar9 = 0; uVar9 != uVar17; uVar9 = uVar9 + 1) {
              iVar2 = matrix->type;
              lVar15 = lVar7;
              uVar16 = uVar9;
              for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
                if (iVar2 == 0) {
                  if ((long)uVar16 < (long)_s1Len) {
                    piVar12 = matrix->matrix +
                              uVar13 * lVar11 + (long)matrix->mapper[(byte)s1[uVar16]];
                    goto LAB_0054b0c9;
                  }
LAB_0054b0ce:
                  iVar10 = '\0';
                }
                else {
                  if ((long)_s1Len <= (long)uVar16) goto LAB_0054b0ce;
                  piVar12 = (int *)((long)matrix->matrix +
                                   lVar15 + (long)matrix->mapper[(byte)matrix->alphabet[uVar13]] * 4
                                   );
LAB_0054b0c9:
                  iVar10 = (int8_t)*piVar12;
                }
                t.v[lVar18] = iVar10;
                uVar16 = uVar16 + (long)iVar3;
                lVar15 = lVar15 + size * 4;
              }
              palVar4[lVar14][0] = t.m[0];
              palVar4[lVar14][1] = t.m[1];
              lVar14 = lVar14 + 1;
              lVar7 = lVar7 + lVar11 * 4;
            }
            uVar13 = uVar13 + 1;
          } while( true );
        }
      }
      return (parasail_profile_t *)0x0;
    }
    pcVar8 = "s1";
  }
  fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_sse_128_8",pcVar8);
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_sse_128_8(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 16; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_8_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile8.score = vProfile;
    profile->free = &parasail_free___m128i;
    return profile;
}